

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestProto3Optional::ByteSizeLong(TestProto3Optional *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar1 = *(uint *)&this->field_0;
  sVar7 = (size_t)((uVar1 >> 0x10 & 2) +
                   (((uVar1 >> 0xb & 0x19) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 5
                  + (((uVar1 >> 0xc & 0x13) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 9
                  );
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar7 = sVar7 + sVar5 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar7 = sVar7 + sVar5 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar7 = sVar7 + sVar5 + 2;
    }
    if ((uVar1 & 8) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestProto3Optional_NestedMessage>
                        ((this->field_0)._impl_.optional_nested_message_);
      sVar7 = sVar7 + sVar5 + 2;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestProto3Optional_NestedMessage>
                        ((this->field_0)._impl_.lazy_nested_message_);
      sVar7 = sVar7 + sVar5 + 2;
    }
    if ((uVar1 & 0x20) != 0) {
      uVar6 = (this->field_0)._impl_.optional_int64_ | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 0x40) != 0) {
      uVar6 = (long)(this->field_0)._impl_.optional_int32_ | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
    if ((char)uVar1 < '\0') {
      uVar4 = (this->field_0)._impl_.optional_uint32_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar2 * 9 + 0x89U >> 6);
    }
  }
  if ((uVar1 & 0x700) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      uVar6 = (this->field_0)._impl_.optional_uint64_ | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::SInt64SizePlusOne
                        ((this->field_0)._impl_.optional_sint64_);
      sVar7 = sVar7 + sVar5;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::SInt32SizePlusOne
                        ((this->field_0)._impl_.optional_sint32_);
      sVar7 = sVar7 + sVar5;
    }
  }
  if ((uVar1 & 0x1c0000) != 0) {
    if ((uVar1 >> 0x12 & 1) != 0) {
      uVar6 = (long)(this->field_0)._impl_.optional_nested_enum_ | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x49U >> 6) + 2;
    }
    if (((uVar1 >> 0x13 & 1) != 0) && (uVar6 = (this->field_0)._impl_.singular_int64_, uVar6 != 0))
    {
      uVar6 = uVar6 | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x49U >> 6) + 2;
    }
    if (((uVar1 >> 0x14 & 1) != 0) &&
       (uVar6 = (ulong)(this->field_0)._impl_.singular_int32_, uVar6 != 0)) {
      uVar6 = uVar6 | 1;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar3 * 9 + 0x49U >> 6) + 2;
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestProto3Optional::ByteSizeLong() const {
  const TestProto3Optional& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestProto3Optional)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x00013000u & cached_has_bits) * 9;
  total_size += ::absl::popcount(0x0000c800u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00020000u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // optional bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // optional string optional_cord = 16 [ctype = CORD];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_cord());
    }
    // optional .proto2_unittest.TestProto3Optional.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // optional .proto2_unittest.TestProto3Optional.NestedMessage lazy_nested_message = 19 [lazy = true];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.lazy_nested_message_);
    }
    // optional int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_optional_int64());
    }
    // optional int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
    // optional uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32());
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    // optional uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_optional_uint64());
    }
    // optional sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
          this_._internal_optional_sint64());
    }
    // optional sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
          this_._internal_optional_sint32());
    }
  }
  if ((cached_has_bits & 0x001c0000u) != 0) {
    // optional .proto2_unittest.TestProto3Optional.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
    }
    // int64 singular_int64 = 23;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (this_._internal_singular_int64() != 0) {
        total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                        this_._internal_singular_int64());
      }
    }
    // int32 singular_int32 = 22;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_singular_int32() != 0) {
        total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                        this_._internal_singular_int32());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}